

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O2

UBool __thiscall icu_63::LocaleKey::fallback(LocaleKey *this)

{
  UnicodeString *this_00;
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  
  if ((undefined1  [56])((undefined1  [56])(this->_currentID).fUnion & (undefined1  [56])0x1) !=
      (undefined1  [56])0x0) {
    return '\0';
  }
  this_00 = &this->_currentID;
  uVar3 = UnicodeString::lastIndexOf(this_00,L'_');
  if (uVar3 == 0xffffffff) {
    if ((undefined1  [56])((undefined1  [56])(this->_fallbackID).fUnion & (undefined1  [56])0x1) ==
        (undefined1  [56])0x0) {
      UnicodeString::operator=(this_00,&this->_fallbackID);
      UnicodeString::setToBogus(&this->_fallbackID);
    }
    else {
      uVar1 = (this->_currentID).fUnion.fStackFields.fLengthAndFlags;
      if ((short)uVar1 < 0) {
        iVar4 = (this->_currentID).fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      if (iVar4 < 1) {
        UnicodeString::setToBogus(this_00);
        return '\0';
      }
      uVar2 = 2;
      if (((int)(short)uVar1 & 1U) == 0) {
        uVar2 = uVar1 & 0x1e;
      }
      (this->_currentID).fUnion.fStackFields.fLengthAndFlags = uVar2;
    }
  }
  else {
    UnicodeString::remove(this_00,(char *)(ulong)uVar3);
  }
  return '\x01';
}

Assistant:

UBool
LocaleKey::fallback() {
    if (!_currentID.isBogus()) {
        int x = _currentID.lastIndexOf(UNDERSCORE_CHAR);
        if (x != -1) {
            _currentID.remove(x); // truncate current or fallback, whichever we're pointing to
            return TRUE;
        }

        if (!_fallbackID.isBogus()) {
            _currentID = _fallbackID;
            _fallbackID.setToBogus();
            return TRUE;
        }

        if (_currentID.length() > 0) {
            _currentID.remove(0); // completely truncate
            return TRUE;
        }

        _currentID.setToBogus();
    }

    return FALSE;
}